

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar5.c
# Opt level: O3

void test_read_format_rar5_stored_skip_all_but_first(void)

{
  int iVar1;
  wchar_t wVar2;
  archive_conflict *a;
  char *pcVar3;
  la_ssize_t lVar4;
  archive_entry *ae;
  char buf [405];
  
  extract_reference_file("test_read_format_rar5_stored_manyfiles.rar");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ƚ',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ƚ',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ƚ',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",a);
  wVar2 = archive_read_open_filename(a,"test_read_format_rar5_stored_manyfiles.rar",0x2800);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ƚ',(uint)(wVar2 == L'\0'),"0 == archive_read_open_filename(a, fname, 10240)",
                   a);
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ƛ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar3 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
             ,L'Ɯ',"make_uue.tcl","\"make_uue.tcl\"",pcVar3,"archive_entry_pathname(ae)",
             (void *)0x0,L'\0');
  lVar4 = archive_read_data((archive *)a,buf,0x195);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'Ɲ',(uint)(lVar4 == 0x195),"405 == archive_read_data(a, buf, sizeof(buf))",a);
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'ƞ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar3 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
             ,L'Ɵ',"cebula.txt","\"cebula.txt\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,
             L'\0');
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'Ơ',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar3 = archive_entry_pathname(ae);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
             ,L'ơ',"test.bin","\"test.bin\"",pcVar3,"archive_entry_pathname(ae)",(void *)0x0,L'\0')
  ;
  iVar1 = archive_read_next_header((archive *)a,&ae);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                   ,L'Ƣ',(uint)(iVar1 == 1),"ARCHIVE_EOF == archive_read_next_header(a, &ae)",a);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'ƣ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar5.c"
                      ,L'ƣ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_rar5_stored_skip_all_but_first)
{
	const char* fname = "test_read_format_rar5_stored_manyfiles.rar";
	char buf[405];

	/* Extract first, skip rest. */

	PROLOGUE(fname);
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualString("make_uue.tcl", archive_entry_pathname(ae));
	assertA(405 == archive_read_data(a, buf, sizeof(buf)));
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualString("cebula.txt", archive_entry_pathname(ae));
	assertA(0 == archive_read_next_header(a, &ae));
	assertEqualString("test.bin", archive_entry_pathname(ae));
	assertA(ARCHIVE_EOF == archive_read_next_header(a, &ae));
	EPILOGUE();
}